

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

char * luaL_checklstring(lua_State *L,int idx,size_t *len)

{
  TValue *pTVar1;
  GCstr *local_98;
  GCstr *s;
  TValue *o;
  size_t *len_local;
  int idx_local;
  lua_State *L_local;
  
  pTVar1 = index2adr(L,idx);
  if ((int)(pTVar1->field_4).it >> 0xf == -5) {
    local_98 = (GCstr *)(pTVar1->u64 & 0x7fffffffffff);
  }
  else {
    if (0xfffffff2 < (uint)((int)(pTVar1->field_4).it >> 0xf)) {
      lj_err_argt(L,idx,4);
    }
    if (*(ulong *)((L->glref).ptr64 + 0x18) <= *(ulong *)((L->glref).ptr64 + 0x10)) {
      lj_gc_step(L);
    }
    pTVar1 = index2adr(L,idx);
    local_98 = lj_strfmt_number(L,pTVar1);
    pTVar1->u64 = (ulong)local_98 | 0xfffd800000000000;
  }
  if (len != (size_t *)0x0) {
    *len = (ulong)local_98->len;
  }
  return (char *)(local_98 + 1);
}

Assistant:

LUALIB_API const char *luaL_checklstring(lua_State *L, int idx, size_t *len)
{
  TValue *o = index2adr(L, idx);
  GCstr *s;
  if (LJ_LIKELY(tvisstr(o))) {
    s = strV(o);
  } else if (tvisnumber(o)) {
    lj_gc_check(L);
    o = index2adr(L, idx);  /* GC may move the stack. */
    s = lj_strfmt_number(L, o);
    setstrV(L, o, s);
  } else {
    lj_err_argt(L, idx, LUA_TSTRING);
  }
  if (len != NULL) *len = s->len;
  return strdata(s);
}